

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O1

char * __thiscall
CNscContext::ReplaceToken(CNscContext *this,char *pszToken,int *nCount,string *pstrNewToken)

{
  DefineEntry *psDefine;
  ulong uVar1;
  bool bVar2;
  _Node_iterator_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
  _Var3;
  ulong uVar4;
  ulong uVar5;
  ReplacedDefineBitmap cReplacedDefines;
  char *local_78;
  vector<bool,_std::allocator<bool>_> local_70;
  int *local_48;
  key_type local_40;
  
  if ((this->m_cDefines).
      super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_cDefines).
      super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_40.nLength = (size_t)*nCount;
    local_40.psz = pszToken;
    _Var3._M_cur = (__node_type *)
                   std::
                   _Hashtable<CNscContext::FastHashMapStr,_std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<CNscContext::FastHashMapStr>,_CNscContext::FastHashMapStrHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->m_cDefineLookup)._M_h,&local_40);
    if (_Var3._M_cur != (__node_type *)0x0) {
      local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = 0;
      local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset = 0;
      local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      local_48 = nCount;
      std::vector<bool,_std::allocator<bool>_>::resize
                (&local_70,
                 (long)(this->m_cDefines).
                       super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_cDefines).
                       super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,false);
      bVar2 = false;
      do {
        psDefine = *(DefineEntry **)
                    ((long)&((_Var3._M_cur)->
                            super__Hash_node_value<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>
                            ._M_storage._M_storage + 0x10);
        uVar1 = psDefine->nId;
        if ((ulong)((long)(this->m_cDefines).
                          super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_cDefines).
                          super__Vector_base<CNscContext::DefineEntry_*,_std::allocator<CNscContext::DefineEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar1) {
          __assert_fail("nDefineIndex < m_cDefines .size ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                        ,0xa72,"char *CNscContext::ReplaceToken(char *, int *, std::string *)");
        }
        uVar4 = uVar1 + 0x3f;
        if (-1 < (long)uVar1) {
          uVar4 = uVar1;
        }
        uVar5 = (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001);
        if ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[((long)uVar4 >> 6) + (uVar5 - 1)] >>
             (uVar1 & 0x3f) & 1) != 0) {
          local_78 = pszToken;
          if (!bVar2) goto LAB_00142d9a;
          break;
        }
        local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[((long)uVar4 >> 6) + (uVar5 - 1)] =
             local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[((long)uVar4 >> 6) + (uVar5 - 1)] |
             1L << ((byte)uVar1 & 0x3f);
        GetDefineValue_abi_cxx11_(this,psDefine,true);
        std::__cxx11::string::_M_assign((string *)pstrNewToken);
        local_40.psz = (pstrNewToken->_M_dataplus)._M_p;
        local_40.nLength = pstrNewToken->_M_string_length;
        _Var3._M_cur = (__node_type *)
                       std::
                       _Hashtable<CNscContext::FastHashMapStr,_std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>,_std::allocator<std::pair<const_CNscContext::FastHashMapStr,_CNscContext::DefineEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<CNscContext::FastHashMapStr>,_CNscContext::FastHashMapStrHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&(this->m_cDefineLookup)._M_h,&local_40);
        bVar2 = true;
      } while (_Var3._M_cur != (__node_type *)0x0);
      *local_48 = (int)pstrNewToken->_M_string_length;
      local_78 = (pstrNewToken->_M_dataplus)._M_p;
LAB_00142d9a:
      pszToken = local_78;
      if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
    }
  }
  return pszToken;
}

Assistant:

char *CNscContext::ReplaceToken (char *pszToken, int *nCount,
	std::string *pstrNewToken)
{
	typedef std::vector <bool> ReplacedDefineBitmap;

	//
	// If we have no defines then just pass through
	//

	if (m_cDefines .empty ())
		return pszToken;

	//
	// Get us out of the common path (no match) as quick as possible
	//

	FastHashMapStr sLookup (pszToken, *nCount);
	DefineLookupMap::const_iterator it = m_cDefineLookup .find (sLookup);

	if (it == m_cDefineLookup .end ())
		return pszToken;

	ReplacedDefineBitmap cReplacedDefines;
	size_t nDefineIndex;
	bool fReplacedAnyToken = false;

	cReplacedDefines .resize (m_cDefines .size ());

	//
	// Loop until we haven't replaced any defines in one iteration
	//

	for (;;)
	{
		//
		// If we have already replaced this define
		//

		nDefineIndex = it ->second ->nId;

		assert (nDefineIndex < m_cDefines .size ());

		if (cReplacedDefines [nDefineIndex])
			break;

		//
		// Mark the define as replaced in the bitmap
		//

		cReplacedDefines [nDefineIndex] = true;
		fReplacedAnyToken = true;

		//
		// Substitute it
		//

		*pstrNewToken = *GetDefineValue (it ->second);
		sLookup = *pstrNewToken;

		it = m_cDefineLookup .find (sLookup);

		if (it == m_cDefineLookup .end ())
			break;
	}

	if (!fReplacedAnyToken)
		return pszToken;

	*nCount = (int) pstrNewToken ->size ();
	return (char *) pstrNewToken ->c_str ();
}